

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O3

InlineWriter * __thiscall adios2::core::engine::InlineReader::GetWriter(InlineReader *this)

{
  IO *pIVar1;
  _Base_ptr p_Var2;
  Mode MVar3;
  long lVar4;
  InlineWriter *pIVar5;
  shared_ptr<adios2::core::Engine> e;
  Engine *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pIVar1 = (this->super_Engine).m_IO;
  if ((pIVar1->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_node_count != 2) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Engine","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"InlineReader","");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"GetWriter","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "There must be exactly one reader and one writer for the inline engine.","");
    helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  p_Var2 = (pIVar1->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b8 = *(Engine **)(p_Var2 + 2);
  local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[2]._M_parent;
  if ((_Base_ptr)local_b0._M_pi != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((_Base_ptr)local_b0._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)local_b0._M_pi)->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&((_Base_ptr)local_b0._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)local_b0._M_pi)->_M_parent + 1;
    }
  }
  MVar3 = Engine::OpenMode(local_b8);
  if (MVar3 == Read) {
    lVar4 = std::_Rb_tree_decrement
                      (&(pIVar1->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header);
    local_b8 = *(Engine **)(lVar4 + 0x40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_b0,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar4 + 0x48));
  }
  if (local_b8 != (Engine *)0x0) {
    pIVar5 = (InlineWriter *)__dynamic_cast(local_b8,&Engine::typeinfo,&InlineWriter::typeinfo,0);
    if (pIVar5 != (InlineWriter *)0x0) goto LAB_0048abe4;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Engine","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"InlineReader","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"GetWriter","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"dynamic_cast<InlineWriter*> failed; this is very likely a bug.",""
            );
  helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pIVar5 = (InlineWriter *)0x0;
LAB_0048abe4:
  if ((_Base_ptr)local_b0._M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
  }
  return pIVar5;
}

Assistant:

const InlineWriter *InlineReader::GetWriter() const
{
    const auto &engine_map = m_IO.GetEngines();
    if (engine_map.size() != 2)
    {
        helper::Throw<std::runtime_error>("Engine", "InlineReader", "GetWriter",
                                          "There must be exactly one reader and one "
                                          "writer for the inline engine.");
    }

    std::shared_ptr<Engine> e = engine_map.begin()->second;
    if (e->OpenMode() == adios2::Mode::Read)
    {
        e = engine_map.rbegin()->second;
    }

    const auto writer = dynamic_cast<InlineWriter *>(e.get());
    if (!writer)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "InlineReader", "GetWriter",
            "dynamic_cast<InlineWriter*> failed; this is very likely a bug.");
    }
    return writer;
}